

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

void __thiscall embree::XML::XML(XML *this,string *name)

{
  string *in_RSI;
  ParseLocation *in_RDI;
  int in_stack_ffffffffffffffcc;
  
  RefCount::RefCount((RefCount *)in_RDI,in_stack_ffffffffffffffcc);
  (in_RDI->fileName).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR__XML_00606c40;
  ParseLocation::ParseLocation(in_RDI);
  std::__cxx11::string::string((string *)&in_RDI[1].lineNumber,in_RSI);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x420a51);
  std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::vector
            ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
             0x420a62);
  std::vector<embree::Token,_std::allocator<embree::Token>_>::vector
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)0x420a73);
  return;
}

Assistant:

XML (const std::string& name = "") : name(name) {}